

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::resize_bilinear
               (tensor *dest,longlong dest_row_stride,longlong dest_channel_stride,tensor *src,
               longlong src_row_stride,longlong src_channel_stride)

{
  uint *puVar1;
  thread_pool_implementation *this;
  task_state_type *ptVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread_pool *this_00;
  unsigned_long uVar6;
  long lVar7;
  code *pcVar8;
  uint64 uVar9;
  ostream *poVar10;
  fatal_error *pfVar11;
  code *pcVar12;
  code *pcVar13;
  string local_238;
  code *local_218;
  thread_pool *local_210;
  code *local_208;
  long local_200;
  longlong src_channel_stride_local;
  longlong src_row_stride_local;
  longlong dest_channel_stride_local;
  longlong dest_row_stride_local;
  helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2326:58)>_>
  local_1d8;
  float *d;
  float *s;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2326:58)>
  local_1b0;
  ostringstream dlib_o_out;
  longlong *local_190;
  float **local_188;
  longlong *local_180;
  tensor *local_178;
  longlong *local_170;
  
  src_channel_stride_local = src_channel_stride;
  src_row_stride_local = src_row_stride;
  dest_channel_stride_local = dest_channel_stride;
  dest_row_stride_local = dest_row_stride;
  if (dest == src) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x90c);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"is_same_object(dest, src)==false");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_190 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_238);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  if (dest->m_n != src->m_n) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x90d);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"dest.num_samples() == src.num_samples()");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_190 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_238);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  if (dest->m_k != src->m_k) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x90e);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::resize_bilinear(tensor &, long long, long long, const tensor &, long long, long long)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"dest.k() == src.k()");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_190 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_238);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  if ((dest->m_size != 0) && (src->m_size != 0)) {
    iVar5 = (*src->_vptr_tensor[2])(src);
    s = (float *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*dest->_vptr_tensor[3])(dest);
    d = (float *)CONCAT44(extraout_var_00,iVar5);
    local_188 = &d;
    pcVar12 = (code *)(dest->m_n * dest->m_k);
    local_190 = &src_row_stride_local;
    local_180 = &dest_channel_stride_local;
    local_170 = &dest_row_stride_local;
    _dlib_o_out = &s;
    local_178 = dest;
    this_00 = default_thread_pool();
    local_1d8.obj = &local_1b0;
    local_1d8.funct =
         (offset_in_helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2326:58)>_to_subr
          )impl::
           helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>
           ::run;
    local_1d8._16_8_ = 0;
    local_1b0.funct = (anon_class_64_8_7869db34 *)&dlib_o_out;
    uVar6 = thread_pool::num_threads_in_pool(this_00);
    if (uVar6 == 0) {
      impl::
      helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>_>
      ::process_block(&local_1d8,0,(long)pcVar12);
    }
    else {
      uVar6 = thread_pool::num_threads_in_pool(this_00);
      lVar7 = (long)pcVar12 / (long)(uVar6 << 3);
      local_200 = 1;
      if (1 < lVar7) {
        local_200 = lVar7;
      }
      pcVar8 = (code *)0x0;
      local_210 = this_00;
      local_208 = pcVar12;
      while ((long)pcVar8 < (long)local_208) {
        this = (local_210->impl).
               super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
        pcVar13 = pcVar8 + local_200;
        local_238._M_dataplus._M_p = (pointer)&this->m;
        local_238._M_string_length = 0;
        local_238.field_2._M_allocated_capacity = 0;
        pcVar12 = local_208;
        if ((long)pcVar13 < (long)local_208) {
          pcVar12 = pcVar13;
        }
        local_218 = pcVar8;
        pthread_mutex_lock((pthread_mutex_t *)local_238._M_dataplus._M_p);
        pcVar8 = (code *)pthread_self();
        lVar7 = thread_pool_implementation::find_empty_task_slot(this);
        if (lVar7 == -1) {
          dest_row_stride = (longlong)pcVar8;
          bVar4 = thread_pool_implementation::is_worker_thread(this,(thread_id_type)pcVar8);
          if (!bVar4) goto LAB_00167ad3;
          auto_mutex::unlock((auto_mutex *)&local_238);
          pcVar8 = local_218;
          impl::
          helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>_>
          ::process_block(&local_1d8,(long)local_218,(long)pcVar12);
        }
        else {
LAB_00167ad3:
          while (lVar7 == -1) {
            signaler::wait(&this->task_done_signaler,(void *)dest_row_stride);
            lVar7 = thread_pool_implementation::find_empty_task_slot(this);
          }
          (this->tasks).array_elements[lVar7].thread_id = (thread_id_type)pcVar8;
          uVar9 = thread_pool_implementation::make_next_task_id(this,lVar7);
          ptVar2 = (this->tasks).array_elements;
          ptVar2[lVar7].task_id = uVar9;
          (*(code *)**ptVar2[lVar7].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
          puVar3 = (undefined8 *)
                   ptVar2[lVar7].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
          pcVar8 = impl::
                   helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>_>
                   ::process_block;
          puVar3[1] = &local_1d8;
          *(undefined4 *)(puVar3 + 2) = 0;
          puVar3[3] = impl::
                      helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2326:58)>_>
                      ::process_block;
          puVar3[4] = 0;
          *puVar3 = &PTR__mp_base_base_001fa640;
          ptVar2 = (this->tasks).array_elements;
          ptVar2[lVar7].arg1 = (long)local_218;
          ptVar2[lVar7].arg2 = (long)pcVar12;
          pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
        }
        auto_mutex::~auto_mutex((auto_mutex *)&local_238);
        dest_row_stride = (longlong)pcVar8;
        pcVar8 = pcVar13;
      }
      thread_pool::wait_for_all_tasks(local_210);
    }
  }
  return;
}

Assistant:

void resize_bilinear (
            tensor& dest,
            long long dest_row_stride,
            long long dest_channel_stride,
            const tensor& src,
            long long src_row_stride,
            long long src_channel_stride
        )
        {
            DLIB_CASSERT(is_same_object(dest, src)==false);
            DLIB_CASSERT(dest.num_samples() == src.num_samples());
            DLIB_CASSERT(dest.k() == src.k());

            if (dest.size() == 0 || src.size() == 0)
                return;

            const float* s = src.host();
            float* d = dest.host();

            parallel_for(0, dest.k()*dest.num_samples(), [&](long i)
            {
                auto simg = sub_image(s+i*src_channel_stride, src.nr(), src.nc(), src_row_stride);
                auto dimg = sub_image(d+i*dest_channel_stride, dest.nr(), dest.nc(), dest_row_stride);

                resize_image(simg, dimg);
            });
        }